

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qktxhandler.cpp
# Opt level: O1

ssize_t __thiscall QKtxHandler::read(QKtxHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  Data *pDVar1;
  qsizetype qVar2;
  quint32 qVar3;
  int *piVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  QLoggingCategory *pQVar11;
  long lVar12;
  char *pcVar13;
  quint32 end;
  uint uVar14;
  undefined4 in_register_00000034;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  QSize *size;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QByteArrayView view;
  QByteArrayView QVar19;
  QTextureFileData texData;
  int local_dc;
  QTextureFileData local_d0;
  QByteArray local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [4];
  Representation RStack_94;
  quint32 qStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  quint32 qStack_4c;
  undefined8 local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  view.m_size = (QKtxHandler *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((view.m_size)->super_QTextureFileHandler).m_device == (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      return (ssize_t)this;
    }
    goto LAB_005490b1;
  }
  local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  if ((ulong)local_c8.d.size >> 0x20 == 0) {
    QVar18.m_data = local_c8.d.ptr;
    QVar18.m_size = local_c8.d.size;
    QVar19.m_data = ktxIdentifier;
    QVar19.m_size = 0xc;
    cVar5 = QtPrivate::startsWith(QVar18,QVar19);
    if (cVar5 == '\0') {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        unique0x00012000 = pQVar11->name;
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78._12_4_ = 0;
        local_78._16_4_ = 0;
        local_78._20_4_ = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          pcVar15 = "Invalid KTX file %s";
          goto LAB_00548a30;
        }
        read((int)pDVar1,pcVar13,(size_t)local_78);
      }
      goto LAB_005486b1;
    }
    if ((ulong)local_c8.d.size < (undefined1 *)0x40) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        unique0x00012000 = pQVar11->name;
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78._12_4_ = 0;
        local_78._16_4_ = 0;
        local_78._20_4_ = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          pcVar15 = "Invalid KTX header size in %s";
          goto LAB_00548a30;
        }
        read((int)pDVar1,pcVar13,(size_t)local_78);
      }
      goto LAB_005486b1;
    }
    pcVar13 = local_c8.d.ptr;
    if (local_c8.d.ptr == (storage_type *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    unique0x100009a9 = *(char **)(pcVar13 + 0x18);
    local_48 = *(undefined8 *)(pcVar13 + 0x30);
    _uStack_40 = *(undefined8 *)(pcVar13 + 0x38);
    local_78._0_4_ = (undefined4)*(undefined8 *)pcVar13;
    local_78._4_4_ = (undefined4)((ulong)*(undefined8 *)pcVar13 >> 0x20);
    local_78._8_4_ = (undefined4)*(undefined8 *)(pcVar13 + 8);
    local_78._12_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar13 + 8) >> 0x20);
    local_78._16_4_ = (undefined4)*(undefined8 *)(pcVar13 + 0x10);
    local_78._20_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar13 + 0x10) >> 0x20);
    local_58 = (uint)*(undefined8 *)(pcVar13 + 0x20);
    uStack_54 = (uint)((ulong)*(undefined8 *)(pcVar13 + 0x20) >> 0x20);
    uStack_50 = (uint)*(undefined8 *)(pcVar13 + 0x28);
    qStack_4c = (quint32)((ulong)*(undefined8 *)(pcVar13 + 0x28) >> 0x20);
    bVar6 = checkHeader(view.m_size,(KTXHeader *)local_78);
    if (!bVar6) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_80 = pQVar11->name;
        local_98 = (undefined1  [4])0x2;
        RStack_94.m_i = 0;
        qStack_90 = 0;
        uStack_8c = 0;
        uStack_88 = 0;
        uStack_84 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          pcVar15 = "Unsupported KTX file format in %s";
          pcVar16 = local_98;
          goto LAB_00548a35;
        }
        read((int)pDVar1,pcVar13,(size_t)local_98);
      }
      goto LAB_005486b1;
    }
    local_d0.d.d.ptr = (QSharedDataPointer<QTextureFileDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextureFileData::QTextureFileData(&local_d0,ByteArrayMode);
    QTextureFileData::setData(&local_d0,&local_c8);
    bVar6 = (view.m_size)->inverseEndian == false;
    local_98 = (undefined1  [4])
               (uStack_54 >> 0x18 | (uStack_54 & 0xff0000) >> 8 | (uStack_54 & 0xff00) << 8 |
               uStack_54 << 0x18);
    if (bVar6) {
      local_98 = (undefined1  [4])uStack_54;
    }
    RStack_94.m_i =
         uStack_50 >> 0x18 | (uStack_50 & 0xff0000) >> 8 | (uStack_50 & 0xff00) << 8 |
         uStack_50 << 0x18;
    if (bVar6) {
      RStack_94.m_i = uStack_50;
    }
    size = (QSize *)local_98;
    QTextureFileData::setSize(&local_d0,size);
    qVar3 = (uint)local_78._24_4_ >> 0x18 | (local_78._24_4_ & 0xff0000) >> 8 |
            (local_78._24_4_ & 0xff00) << 8 | local_78._24_4_ << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = local_78._24_4_;
    }
    QTextureFileData::setGLFormat(&local_d0,qVar3);
    qVar3 = uStack_5c >> 0x18 | (uStack_5c & 0xff0000) >> 8 | (uStack_5c & 0xff00) << 8 |
            uStack_5c << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = uStack_5c;
    }
    QTextureFileData::setGLInternalFormat(&local_d0,qVar3);
    qVar3 = local_58 >> 0x18 | (local_58 & 0xff0000) >> 8 | (local_58 & 0xff00) << 8 |
            local_58 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = local_58;
    }
    QTextureFileData::setGLBaseInternalFormat(&local_d0,qVar3);
    uVar17 = uStack_40 >> 0x18 | (uStack_40 & 0xff0000) >> 8 | (uStack_40 & 0xff00) << 8 |
             uStack_40 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar17 = uStack_40;
    }
    QTextureFileData::setNumLevels(&local_d0,uVar17);
    uVar17 = uStack_44 >> 0x18 | (uStack_44 & 0xff0000) >> 8 | (uStack_44 & 0xff00) << 8 |
             uStack_44 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar17 = uStack_44;
    }
    QTextureFileData::setNumFaces(&local_d0,uVar17);
    uVar17 = uStack_3c >> 0x18 | (uStack_3c & 0xff0000) >> 8 | (uStack_3c & 0xff00) << 8 |
             uStack_3c << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar17 = uStack_3c;
    }
    uVar14 = uVar17 + 0x40;
    if (uVar17 < 0xffffffc0) {
      if ((uint)local_c8.d.size <= uVar14) {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_80 = pQVar11->name;
          local_98 = (undefined1  [4])0x2;
          RStack_94.m_i = 0;
          qStack_90 = 0;
          uStack_8c = 0;
          uStack_88 = 0;
          uStack_84 = 0;
          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          if (pDVar1 == (Data *)0x0) {
            if (pcVar13 == (char *)0x0) {
              pcVar13 = (char *)&QByteArray::_empty;
            }
            pcVar15 = "OOB request in KTX file %s";
            goto LAB_00548fad;
          }
          read((int)pDVar1,pcVar13,(size_t)local_98);
        }
        goto LAB_00549098;
      }
      if (uVar17 == 0) {
LAB_00548ae6:
        local_98 = (undefined1  [4])uStack_54;
        RStack_94.m_i = uStack_50;
        qStack_90 = qStack_4c;
        lVar12 = 4;
        do {
          if ((uint)(size->wd).m_i < *(uint *)(local_98 + lVar12)) {
            size = (QSize *)(local_98 + lVar12);
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        uVar17 = (size->wd).m_i;
        uVar7 = 0x20;
        if (uVar17 != 0) {
          uVar7 = 0x1f;
          if (uVar17 != 0) {
            for (; uVar17 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = uVar7 ^ 0x1f;
        }
        iVar8 = QTextureFileData::numLevels(&local_d0);
        if ((int)(0x20 - uVar7) < iVar8) {
          pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
          if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            local_80 = pQVar11->name;
            local_98 = (undefined1  [4])0x2;
            RStack_94.m_i = 0;
            qStack_90 = 0;
            uStack_8c = 0;
            uStack_88 = 0;
            uStack_84 = 0;
            pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
            pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
            if (pDVar1 == (Data *)0x0) {
              if (pcVar13 == (char *)0x0) {
                pcVar13 = (char *)&QByteArray::_empty;
              }
              pcVar15 = "Too many levels in KTX file %s";
LAB_00548fad:
              uStack_84 = 0;
              uStack_88 = 0;
              uStack_8c = 0;
              qStack_90 = 0;
              RStack_94.m_i = 0;
              local_98 = (undefined1  [4])0x2;
              QMessageLogger::warning(local_98,pcVar15,pcVar13);
            }
            else {
              read((int)pDVar1,pcVar13,(size_t)local_98);
            }
          }
        }
        else {
          iVar8 = QTextureFileData::numFaces(&local_d0);
          if ((iVar8 == 1) || (iVar8 = QTextureFileData::numFaces(&local_d0), iVar8 == 6)) {
            iVar8 = QTextureFileData::numLevels(&local_d0);
            if (0 < iVar8) {
              local_dc = 0;
              do {
                uVar17 = uVar14 + 4;
                if ((uVar14 < 0xfffffffc) && (uVar17 <= (uint)local_c8.d.size)) {
                  uVar14 = *(uint *)(local_c8.d.ptr + uVar14);
                  uVar7 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                          uVar14 << 0x18;
                  if ((view.m_size)->inverseEndian == false) {
                    uVar7 = uVar14;
                  }
                  iVar8 = QTextureFileData::numFaces(&local_d0);
                  bVar6 = iVar8 < 1;
                  uVar14 = uVar17;
                  if (0 < iVar8) {
                    uVar17 = uVar7 + 3 & 0xfffffffc;
                    iVar8 = 0;
                    do {
                      QTextureFileData::setDataOffset(&local_d0,uVar14,local_dc,iVar8);
                      QTextureFileData::setDataLength(&local_d0,uVar7,local_dc,iVar8);
                      if (uVar7 < 0xfffffffd) {
                        uVar9 = uVar14 + uVar17;
                        if (CARRY4(uVar14,uVar17)) {
                          pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                          if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U)
                              != 0) {
                            local_80 = pQVar11->name;
                            local_98 = (undefined1  [4])0x2;
                            RStack_94.m_i = 0;
                            qStack_90 = 0;
                            uStack_8c = 0;
                            uStack_88 = 0;
                            uStack_84 = 0;
                            pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                            pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                            if (pDVar1 == (Data *)0x0) {
                              if (pcVar13 == (char *)0x0) {
                                pcVar13 = (char *)&QByteArray::_empty;
                              }
                              QMessageLogger::warning(local_98,"OOB request in KTX file %s",pcVar13)
                              ;
                            }
                            else {
                              read((int)pDVar1,pcVar13,(size_t)local_98);
                            }
                          }
                          QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode)
                          ;
                          uVar9 = uVar14;
                        }
                        bVar6 = !CARRY4(uVar14,uVar17);
                        uVar14 = uVar9;
                      }
                      else {
                        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) !=
                            0) {
                          local_80 = pQVar11->name;
                          local_98 = (undefined1  [4])0x2;
                          RStack_94.m_i = 0;
                          qStack_90 = 0;
                          uStack_8c = 0;
                          uStack_88 = 0;
                          uStack_84 = 0;
                          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                          pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                          if (pDVar1 == (Data *)0x0) {
                            if (pcVar13 == (char *)0x0) {
                              pcVar13 = (char *)&QByteArray::_empty;
                            }
                            QMessageLogger::warning(local_98,"Overflow in KTX file %s",pcVar13);
                          }
                          else {
                            read((int)pDVar1,pcVar13,(size_t)local_98);
                          }
                        }
                        bVar6 = false;
                        QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
                      }
                      if (!bVar6) {
                        bVar6 = false;
                        break;
                      }
                      iVar8 = iVar8 + 1;
                      iVar10 = QTextureFileData::numFaces(&local_d0);
                      bVar6 = iVar10 <= iVar8;
                    } while (iVar8 < iVar10);
                  }
                }
                else {
                  pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                  if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
                    local_80 = pQVar11->name;
                    local_98 = (undefined1  [4])0x2;
                    RStack_94.m_i = 0;
                    qStack_90 = 0;
                    uStack_8c = 0;
                    uStack_88 = 0;
                    uStack_84 = 0;
                    pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                    pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                    if (pDVar1 == (Data *)0x0) {
                      if (pcVar13 == (char *)0x0) {
                        pcVar13 = (char *)&QByteArray::_empty;
                      }
                      QMessageLogger::warning(local_98,"OOB request in KTX file %s",pcVar13);
                    }
                    else {
                      read((int)pDVar1,pcVar13,(size_t)local_98);
                    }
                  }
                  bVar6 = false;
                  QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
                }
                if (!bVar6) goto LAB_005490a2;
                local_dc = local_dc + 1;
                iVar8 = QTextureFileData::numLevels(&local_d0);
              } while (local_dc < iVar8);
            }
            bVar6 = QTextureFileData::isValid(&local_d0);
            if (bVar6) {
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              local_98 = SUB84(pDVar1,0);
              RStack_94.m_i = (int)((ulong)pDVar1 >> 0x20);
              pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              qStack_90 = (quint32)pcVar13;
              uStack_8c = (undefined4)((ulong)pcVar13 >> 0x20);
              qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
              uStack_88 = (undefined4)qVar2;
              uStack_84 = (undefined4)((ulong)qVar2 >> 0x20);
              if (pDVar1 != (Data *)0x0) {
                LOCK();
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              QTextureFileData::setLogName(&local_d0,(QByteArray *)local_98);
              piVar4 = (int *)CONCAT44(RStack_94.m_i,local_98);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),1,0x10);
                }
              }
              QTextureFileData::QTextureFileData((QTextureFileData *)this,&local_d0);
              goto LAB_005490a2;
            }
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar11->name;
              local_98 = (undefined1  [4])0x2;
              RStack_94.m_i = 0;
              qStack_90 = 0;
              uStack_8c = 0;
              uStack_88 = 0;
              uStack_84 = 0;
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              if (pDVar1 == (Data *)0x0) {
                if (pcVar13 == (char *)0x0) {
                  pcVar13 = (char *)&QByteArray::_empty;
                }
                pcVar15 = "Invalid values in header of KTX file %s";
                goto LAB_00548fad;
              }
              read((int)pDVar1,pcVar13,(size_t)local_98);
            }
          }
          else {
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar11->name;
              local_98 = (undefined1  [4])0x2;
              RStack_94.m_i = 0;
              qStack_90 = 0;
              uStack_8c = 0;
              uStack_88 = 0;
              uStack_84 = 0;
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              if (pDVar1 == (Data *)0x0) {
                if (pcVar13 == (char *)0x0) {
                  pcVar13 = (char *)&QByteArray::_empty;
                }
                pcVar15 = "Invalid number of faces in KTX file %s";
                goto LAB_00548fad;
              }
              read((int)pDVar1,pcVar13,(size_t)local_98);
            }
          }
        }
        goto LAB_00549098;
      }
      if ((uint)local_c8.d.size < uVar14) {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_80 = pQVar11->name;
          local_98 = (undefined1  [4])0x2;
          RStack_94.m_i = 0;
          qStack_90 = 0;
          uStack_8c = 0;
          uStack_88 = 0;
          uStack_84 = 0;
          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          if (pDVar1 == (Data *)0x0) {
            if (pcVar13 == (char *)0x0) {
              pcVar13 = (char *)&QByteArray::_empty;
            }
            pcVar15 = "Invalid view in KTX file %s";
            goto LAB_00548fad;
          }
          read((int)pDVar1,pcVar13,(size_t)local_98);
        }
        goto LAB_00549098;
      }
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      view.m_data._0_4_ = uVar17;
      view.m_data._4_4_ = 0;
      decodeKeyValues((QKtxHandler *)local_a8,view);
      cVar5 = local_a8[8];
      if (local_a8[8] == '\0') {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_80 = pQVar11->name;
          local_98 = (undefined1  [4])0x2;
          RStack_94.m_i = 0;
          qStack_90 = 0;
          uStack_8c = 0;
          uStack_88 = 0;
          uStack_84 = 0;
          pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          if (pDVar1 == (Data *)0x0) {
            if (pcVar13 == (char *)0x0) {
              pcVar13 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::warning(local_98,"Could not parse key values in KTX file %s",pcVar13);
          }
          else {
            read((int)pDVar1,pcVar13,(size_t)local_98);
          }
        }
        QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      }
      else {
        QTextureFileData::setKeyValueMetadata(&local_d0,(QMap<QByteArray,_QByteArray> *)local_a8);
      }
      if (local_a8[8] == '\x01') {
        local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                    *)local_a8);
      }
      if (cVar5 != '\0') goto LAB_00548ae6;
    }
    else {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_80 = pQVar11->name;
        local_98 = (undefined1  [4])0x2;
        RStack_94.m_i = 0;
        qStack_90 = 0;
        uStack_8c = 0;
        uStack_88 = 0;
        uStack_84 = 0;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        if (pDVar1 == (Data *)0x0) {
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          pcVar15 = "Overflow in size of key value data in header of KTX file %s";
          goto LAB_00548fad;
        }
        read((int)pDVar1,pcVar13,(size_t)local_98);
      }
LAB_00549098:
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
    }
LAB_005490a2:
    QTextureFileData::~QTextureFileData(&local_d0);
  }
  else {
    pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
    if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      unique0x00012000 = pQVar11->name;
      local_78[0] = '\x02';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78._12_4_ = 0;
      local_78._16_4_ = 0;
      local_78._20_4_ = 0;
      pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
      pcVar13 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
      if (pDVar1 == (Data *)0x0) {
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        pcVar15 = "Too big KTX file %s";
LAB_00548a30:
        local_78._20_4_ = 0;
        local_78._16_4_ = 0;
        local_78._12_4_ = 0;
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        pcVar16 = local_78;
LAB_00548a35:
        QMessageLogger::warning(pcVar16,pcVar15,pcVar13);
      }
      else {
        read((int)pDVar1,pcVar13,(size_t)local_78);
      }
    }
LAB_005486b1:
    QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ssize_t)this;
  }
LAB_005490b1:
  __stack_chk_fail();
}

Assistant:

QTextureFileData QKtxHandler::read()
{
    if (!device())
        return QTextureFileData();

    const QByteArray buf = device()->readAll();
    if (static_cast<size_t>(buf.size()) > std::numeric_limits<quint32>::max()) {
        qCWarning(lcQtGuiTextureIO, "Too big KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (!canRead(QByteArray(), buf)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (buf.size() < qsizetype(qktxh_headerSize)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX header size in %s", logName().constData());
        return QTextureFileData();
    }

    KTXHeader header;
    memcpy(&header, buf.data(), qktxh_headerSize);
    if (!checkHeader(header)) {
        qCWarning(lcQtGuiTextureIO, "Unsupported KTX file format in %s", logName().constData());
        return QTextureFileData();
    }

    QTextureFileData texData;
    texData.setData(buf);

    texData.setSize(QSize(decode(header.pixelWidth), decode(header.pixelHeight)));
    texData.setGLFormat(decode(header.glFormat));
    texData.setGLInternalFormat(decode(header.glInternalFormat));
    texData.setGLBaseInternalFormat(decode(header.glBaseInternalFormat));

    texData.setNumLevels(decode(header.numberOfMipmapLevels));
    texData.setNumFaces(decode(header.numberOfFaces));

    const quint32 bytesOfKeyValueData = decode(header.bytesOfKeyValueData);
    quint32 headerKeyValueSize;
    if (qAddOverflow(qktxh_headerSize, bytesOfKeyValueData, &headerKeyValueSize)) {
        qCWarning(lcQtGuiTextureIO, "Overflow in size of key value data in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    if (headerKeyValueSize >= quint32(buf.size())) {
        qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    // File contains key/values
    if (bytesOfKeyValueData > 0) {
        auto keyValueDataView = safeView(buf, qktxh_headerSize, bytesOfKeyValueData);
        if (keyValueDataView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "Invalid view in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        auto keyValues = decodeKeyValues(keyValueDataView);
        if (!keyValues) {
            qCWarning(lcQtGuiTextureIO, "Could not parse key values in KTX file %s",
                     logName().constData());
            return QTextureFileData();
        }

        texData.setKeyValueMetadata(*keyValues);
    }

    // Technically, any number of levels is allowed but if the value is bigger than
    // what is possible in KTX V2 (and what makes sense) we return an error.
    // maxLevels = log2(max(width, height, depth))
    const int maxLevels = (sizeof(quint32) * 8)
            - qCountLeadingZeroBits(std::max(
                    { header.pixelWidth, header.pixelHeight, header.pixelDepth }));

    if (texData.numLevels() > maxLevels) {
        qCWarning(lcQtGuiTextureIO, "Too many levels in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (texData.numFaces() != 1 && texData.numFaces() != 6) {
        qCWarning(lcQtGuiTextureIO, "Invalid number of faces in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    quint32 offset = headerKeyValueSize;
    for (int level = 0; level < texData.numLevels(); level++) {
        const auto imageSizeView = safeView(buf, offset, sizeof(quint32));
        if (imageSizeView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        const quint32 imageSize = decode(qFromUnaligned<quint32>(imageSizeView.data()));
        offset += sizeof(quint32); // overflow checked indirectly above

        for (int face = 0; face < texData.numFaces(); face++) {
            texData.setDataOffset(offset, level, face);
            texData.setDataLength(imageSize, level, face);

            // Add image data and padding to offset
            const auto padded = nearestMultipleOf4(imageSize);
            if (!padded) {
                qCWarning(lcQtGuiTextureIO, "Overflow in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            quint32 offsetNext;
            if (qAddOverflow(offset, *padded, &offsetNext)) {
                qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            offset = offsetNext;
        }
    }

    if (!texData.isValid()) {
        qCWarning(lcQtGuiTextureIO, "Invalid values in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    texData.setLogName(logName());

#ifdef KTX_DEBUG
    qDebug() << "KTX file handler read" << texData;
#endif

    return texData;
}